

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

bool IsGoodConstantArray(ExpressionContext *ctx,VmModule *module,VmInstruction *instInit)

{
  VmValueType VVar1;
  bool bVar2;
  VmInstruction *instInit_00;
  ulong uVar3;
  int iVar4;
  VmInstruction *pVVar5;
  bool bVar6;
  bool bVar7;
  
  if (instInit->cmd != VM_INST_ARRAY) {
    __assert_fail("instInit->cmd == VM_INST_ARRAY",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xc34,
                  "bool IsGoodConstantArray(ExpressionContext &, VmModule *, VmInstruction *)");
  }
  bVar7 = (instInit->arguments).count == 0;
  if (!bVar7) {
    uVar3 = 0;
    do {
      pVVar5 = (VmInstruction *)(instInit->arguments).data[uVar3];
      if ((pVVar5 == (VmInstruction *)0x0) ||
         (instInit_00 = pVVar5, (pVVar5->super_VmValue).typeID != 2)) {
        instInit_00 = (VmInstruction *)0x0;
      }
      iVar4 = 0;
      bVar6 = true;
      if (instInit_00 != (VmInstruction *)0x0) {
        if (instInit_00->cmd == VM_INST_ARRAY) {
          bVar2 = IsGoodConstantArray(ctx,module,instInit_00);
          bVar6 = !bVar2;
          iVar4 = (uint)bVar2 << 2;
        }
        else if (instInit_00->cmd == VM_INST_DOUBLE_TO_FLOAT) {
          if ((instInit_00->arguments).count == 0) {
LAB_0019c6f0:
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                         );
          }
          pVVar5 = (VmInstruction *)*(instInit_00->arguments).data;
        }
        else {
          RunConstantPropagation(ctx,module,&instInit_00->super_VmValue,true);
          if ((instInit->arguments).count <= uVar3) goto LAB_0019c6f0;
          pVVar5 = (VmInstruction *)(instInit->arguments).data[uVar3];
        }
      }
      if (bVar6) {
        if ((pVVar5 == (VmInstruction *)0x0) || ((pVVar5->super_VmValue).typeID != 1)) {
          pVVar5 = (VmInstruction *)0x0;
        }
        iVar4 = 1;
        if ((pVVar5 != (VmInstruction *)0x0) &&
           (*(char *)((long)&(pVVar5->arguments).allocator + 1) == '\0')) {
          VVar1 = (pVVar5->super_VmValue).type.type;
          iVar4 = 4;
          if ((2 < VVar1 - VM_TYPE_INT) &&
             ((VVar1 != VM_TYPE_STRUCT || ((pVVar5->arguments).little[0] == (VmValue *)0x0)))) {
            iVar4 = 1;
          }
        }
      }
      if (iVar4 != 4) {
        return bVar7;
      }
      uVar3 = uVar3 + 1;
      bVar6 = uVar3 < (instInit->arguments).count;
      bVar7 = !bVar6;
    } while (bVar6);
  }
  return bVar7;
}

Assistant:

bool IsGoodConstantArray(ExpressionContext &ctx, VmModule *module, VmInstruction *instInit)
{
	assert(instInit->cmd == VM_INST_ARRAY);

	for(unsigned i = 0; i < instInit->arguments.size(); i++)
	{
		VmValue *elementValue = instInit->arguments[i];

		if(VmInstruction *elementInst = getType<VmInstruction>(elementValue))
		{
			if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
			{
				elementValue = elementInst->arguments[0];
			}
			else if(elementInst->cmd == VM_INST_ARRAY)
			{
				if(IsGoodConstantArray(ctx, module, elementInst))
					continue;
			}
			else
			{
				RunConstantPropagation(ctx, module, elementInst, true);
				elementValue = instInit->arguments[i];
			}
		}

		VmConstant *element = getType<VmConstant>(elementValue);

		if(!element || element->isReference)
			return false;

		if(element->type.type == VM_TYPE_INT)
			continue;
		else if(element->type.type == VM_TYPE_DOUBLE)
			continue;
		else if(element->type.type == VM_TYPE_LONG)
			continue;
		else if(element->type.type == VM_TYPE_STRUCT && element->sValue)
			continue;

		return false;
	}

	return true;
}